

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-opcnt.cc
# Opt level: O2

void __thiscall
wabt::OpcodeInfo::OpcodeInfo<unsigned_long>
          (OpcodeInfo *this,Opcode opcode,Kind kind,unsigned_long *data,size_t count)

{
  pointer __dest;
  
  (this->opcode_).enum_ = opcode.enum_;
  this->kind_ = kind;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (count != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->data_,count << 3);
    __dest = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    memcpy(__dest,data,
           (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)__dest);
    return;
  }
  return;
}

Assistant:

OpcodeInfo::OpcodeInfo(Opcode opcode, Kind kind)
    : opcode_(opcode), kind_(kind) {}